

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O3

void libtest::unit_test<libtest::a_plus_b>::gen
               (usize small_gen_num,usize large_gen_num,bool testcase_cache)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  _List **pp_Var5;
  _List *p_Var6;
  _List *in_RCX;
  unit_test<libtest::a_plus_b> *puVar7;
  path *ppVar8;
  bool bVar9;
  path input_file_path;
  path output_file_path;
  path local_110;
  ansi_sgr local_e8;
  unit_test<libtest::a_plus_b> *local_e0;
  unit_test<libtest::a_plus_b> *local_d8;
  undefined1 local_d0 [32];
  _List *local_b0;
  path local_a8;
  path local_80;
  path local_58;
  
  local_110._M_pathname._M_dataplus._M_p = (pointer)0x24;
  local_e0 = (unit_test<libtest::a_plus_b> *)large_gen_num;
  local_d8 = (unit_test<libtest::a_plus_b> *)small_gen_num;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_110,"[----------] ");
  local_110._M_pathname._M_dataplus._M_p = (pointer)0x100000025;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)&local_110,"Generate tests\n");
  if ((gen(unsigned_long,unsigned_long,bool)::input_file == '\0') &&
     (iVar3 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::input_file), iVar3 != 0))
  {
    std::ofstream::ofstream(gen(unsigned_long,unsigned_long,bool)::input_file);
    __cxa_atexit(std::ofstream::~ofstream,gen(unsigned_long,unsigned_long,bool)::input_file,
                 &__dso_handle);
    __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::input_file);
  }
  if ((gen(unsigned_long,unsigned_long,bool)::output_file == '\0') &&
     (iVar3 = __cxa_guard_acquire(&gen(unsigned_long,unsigned_long,bool)::output_file), iVar3 != 0))
  {
    std::ifstream::ifstream(gen(unsigned_long,unsigned_long,bool)::output_file);
    __cxa_atexit(std::ifstream::~ifstream,gen(unsigned_long,unsigned_long,bool)::output_file,
                 &__dso_handle);
    __cxa_guard_release(&gen(unsigned_long,unsigned_long,bool)::output_file);
  }
  test_case_dir_abi_cxx11_();
  std::filesystem::create_directory(&local_110);
  gen_case_dir_abi_cxx11_();
  std::filesystem::create_directory((path *)local_d0);
  std::filesystem::__cxx11::path::~path((path *)local_d0);
  std::filesystem::__cxx11::path::~path(&local_110);
  if (local_d8 != (unit_test<libtest::a_plus_b> *)0x0) {
    puVar7 = (unit_test<libtest::a_plus_b> *)0x1;
    do {
      small_genfile_path_abi_cxx11_(&local_110,puVar7,1,SUB81(in_RCX,0));
      small_genfile_path_abi_cxx11_((path *)local_d0,puVar7,0,SUB81(in_RCX,0));
      if (((!testcase_cache) || (cVar1 = std::filesystem::status(&local_110), cVar1 == '\0')) ||
         (cVar1 == -1)) {
        local_e8.m_color = green;
        local_e8.m_attr = reset;
        printer::cprintf<char_const*>((printer *)&g_printer,&local_e8,"[ GENERATE ] ");
        if ((_List *)local_110._M_pathname._M_string_length == (_List *)0x0) {
LAB_00107837:
          std::filesystem::__cxx11::path::path(&local_a8);
        }
        else {
          uVar2 = local_110._32_4_;
          ppVar8 = &local_110;
          if ((~local_110._M_cmpts & 3) != 0) {
            if (((local_110._32_8_ & 3) == 0) &&
               ((local_110._M_pathname._M_dataplus._M_p + -1)
                [local_110._M_pathname._M_string_length] != '/')) {
              if ((local_110._32_8_ & 3) == 0) {
                lVar4 = std::filesystem::__cxx11::path::_List::end();
                p_Var6 = (_List *)(lVar4 + -0x10);
                ppVar8 = (path *)(lVar4 + -0x30);
                if ((local_110._32_8_ & 3) != 0) {
                  p_Var6 = &local_110._M_cmpts;
                  ppVar8 = &local_110;
                }
                uVar2 = (uint)*(undefined8 *)p_Var6;
              }
              if ((~uVar2 & 3) == 0) goto LAB_00107830;
            }
            goto LAB_00107837;
          }
LAB_00107830:
          std::filesystem::__cxx11::path::path(&local_a8,ppVar8);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_a8);
        std::filesystem::__cxx11::path::~path(&local_a8);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        a_plus_b::generate_input<libtest::a_plus_b::small_constraints>
                  ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
        std::ifstream::open(gen(unsigned_long,unsigned_long,bool)::output_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,(color)local_d0._0_8_)
        ;
        local_e8.m_color = green;
        local_e8.m_attr = reset;
        printer::cprintf<char_const*>((printer *)&g_printer,&local_e8,"[ GENERATE ] ");
        in_RCX = (_List *)local_d0._8_8_;
        if ((_List *)local_d0._8_8_ == (_List *)0x0) {
LAB_0010792e:
          std::filesystem::__cxx11::path::path(&local_58);
        }
        else {
          uVar2 = (uint)local_b0;
          ppVar8 = (path *)local_d0;
          if ((~(byte)local_b0 & 3) != 0) {
            if ((((ulong)local_b0 & 3) == 0) &&
               (((pointer)(local_d0._0_8_ + -1))[local_d0._8_8_] != '/')) {
              if (((ulong)local_b0 & 3) == 0) {
                lVar4 = std::filesystem::__cxx11::path::_List::end();
                pp_Var5 = (_List **)(lVar4 + -0x10);
                ppVar8 = (path *)(lVar4 + -0x30);
                if (((ulong)local_b0 & 3) != 0) {
                  pp_Var5 = &local_b0;
                  ppVar8 = (path *)local_d0;
                }
                uVar2 = (uint)*pp_Var5;
                in_RCX = local_b0;
              }
              if ((~uVar2 & 3) == 0) goto LAB_00107924;
            }
            goto LAB_0010792e;
          }
LAB_00107924:
          std::filesystem::__cxx11::path::path(&local_58,ppVar8);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_58);
        std::filesystem::__cxx11::path::~path(&local_58);
        a_plus_b::generate_output
                  ((ifstream *)gen(unsigned_long,unsigned_long,bool)::output_file,
                   (ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
        std::ifstream::close();
      }
      std::filesystem::__cxx11::path::~path((path *)local_d0);
      std::filesystem::__cxx11::path::~path(&local_110);
      puVar7 = puVar7 + 1;
    } while (puVar7 <= local_d8);
  }
  if (local_e0 != (unit_test<libtest::a_plus_b> *)0x0) {
    puVar7 = (unit_test<libtest::a_plus_b> *)0x1;
    do {
      large_genfile_path_abi_cxx11_(&local_110,puVar7,1,SUB81(in_RCX,0));
      if (((!testcase_cache) || (cVar1 = std::filesystem::status(&local_110), cVar1 == '\0')) ||
         (cVar1 == -1)) {
        local_d0._0_4_ = green;
        local_d0._4_4_ = reset;
        printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_d0,"[ GENERATE ] ");
        in_RCX = (_List *)local_110._M_pathname._M_string_length;
        if ((_List *)local_110._M_pathname._M_string_length == (_List *)0x0) {
LAB_00107a79:
          std::filesystem::__cxx11::path::path(&local_80);
        }
        else {
          uVar2 = local_110._32_4_;
          ppVar8 = &local_110;
          if ((~local_110._M_cmpts & 3) != 0) {
            if (((local_110._32_8_ & 3) == 0) &&
               ((local_110._M_pathname._M_dataplus._M_p + -1)
                [local_110._M_pathname._M_string_length] != '/')) {
              if ((local_110._32_8_ & 3) == 0) {
                lVar4 = std::filesystem::__cxx11::path::_List::end();
                bVar9 = (local_110._32_8_ & 3) != 0;
                ppVar8 = (path *)(lVar4 + -0x30);
                if (bVar9) {
                  ppVar8 = &local_110;
                }
                in_RCX = &local_110._M_cmpts;
                p_Var6 = (_List *)(lVar4 + -0x10);
                if (bVar9) {
                  p_Var6 = in_RCX;
                }
                uVar2 = (uint)*(undefined8 *)p_Var6;
              }
              if ((~uVar2 & 3) == 0) goto LAB_00107a6f;
            }
            goto LAB_00107a79;
          }
LAB_00107a6f:
          std::filesystem::__cxx11::path::path(&local_80,ppVar8);
        }
        cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_80);
        std::filesystem::__cxx11::path::~path(&local_80);
        std::ofstream::open(gen(unsigned_long,unsigned_long,bool)::input_file,
                            (_Ios_Openmode)local_110._M_pathname._M_dataplus._M_p);
        a_plus_b::generate_input<libtest::a_plus_b::large_constraints>
                  ((ofstream *)gen(unsigned_long,unsigned_long,bool)::input_file);
        std::ofstream::close();
      }
      std::filesystem::__cxx11::path::~path(&local_110);
      puVar7 = puVar7 + 1;
    } while (puVar7 <= local_e0);
  }
  return;
}

Assistant:

static void gen(const usize small_gen_num, const usize large_gen_num, const bool testcase_cache)
    {
        cprintf(base_color, "[----------] "), cprintf(bold_message_color, "Generate tests\n");
        static std::ofstream input_file;
        static std::ifstream output_file;
        fs::create_directory(test_case_dir()), fs::create_directory(gen_case_dir());
        for (usize index = 1; index <= small_gen_num; index++) {
            const fs::path input_file_path = small_genfile_path(index, true), output_file_path = small_genfile_path(index, false);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::small_constraints>(input_file);
            input_file.close(), output_file.open(input_file_path), input_file.open(output_file_path);
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, output_file_path.filename());
            Problem::generate_output(output_file, input_file);
            input_file.close(), output_file.close();
        }
        for (usize index = 1; index <= large_gen_num; index++) {
            const fs::path input_file_path = large_genfile_path(index, true);
            if (testcase_cache and fs::exists(input_file_path)) { continue; }
            cprintf(ac_color, "[ GENERATE ] "), cprintln(message_color, input_file_path.filename());
            input_file.open(input_file_path);
            Problem::template generate_input<typename Problem::large_constraints>(input_file);
            input_file.close();
        }
    }